

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  string local_230 [32];
  undefined1 local_210 [8];
  ostringstream ss;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *generator;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *make;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *buildCommand;
  
  make._7_1_ = 0;
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  this_local = (cmExtraCodeLiteGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_MAKE_PROGRAM",&local_51);
  psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pcVar1 = local_20;
  local_30 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_GENERATOR",&local_91);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_70 = psVar3;
  bVar2 = std::operator==(psVar3,"Unix Makefiles");
  if ((bVar2) || (bVar2 = std::operator==(local_70,"MinGW Makefiles"), bVar2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    poVar4 = std::operator<<((ostream *)local_210,(string *)local_30);
    std::operator<<(poVar4," -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).o");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_230);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetSingleFileBuildCommand(
  const cmMakefile* mf) const
{
  std::string buildCommand;
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  if (generator == "Unix Makefiles" || generator == "MinGW Makefiles") {
    std::ostringstream ss;
#if defined(_WIN32)
    ss << make << " -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).obj";
#else
    ss << make << " -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).o";
#endif
    buildCommand = ss.str();
  }
  return buildCommand;
}